

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBufferToImage::Support::Support
          (Support *this,ResourceDescription *resourceDesc,AccessMode mode)

{
  bool bVar1;
  VkQueueFlags VVar2;
  
  (this->super_OperationSupport)._vptr_OperationSupport =
       (_func_int **)&PTR__OperationSupport_00c0a590;
  this->m_mode = mode;
  if (resourceDesc->type == RESOURCE_TYPE_IMAGE) {
    bVar1 = ::vk::isDepthStencilFormat(resourceDesc->imageFormat);
    VVar2 = (uint)!bVar1 + (uint)!bVar1 * 2 + 1;
  }
  else {
    VVar2 = 4;
  }
  this->m_requiredQueueFlags = VVar2;
  return;
}

Assistant:

Support (const ResourceDescription& resourceDesc, const AccessMode mode)
		: m_mode				(mode)
		, m_requiredQueueFlags	(resourceDesc.type == RESOURCE_TYPE_IMAGE && isDepthStencilFormat(resourceDesc.imageFormat) ? VK_QUEUE_GRAPHICS_BIT : VK_QUEUE_TRANSFER_BIT)
	{
		// From spec:
		//   Because depth or stencil aspect buffer to image copies may require format conversions on some implementations,
		//   they are not supported on queues that do not support graphics.

		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_mode == ACCESS_MODE_WRITE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || resourceDesc.type != RESOURCE_TYPE_BUFFER);
		DE_ASSERT(m_mode == ACCESS_MODE_WRITE || resourceDesc.type != RESOURCE_TYPE_IMAGE);
	}